

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLReader::getSpaces(XMLReader *this,XMLBuffer *toFill)

{
  bool bVar1;
  XMLCh local_22;
  XMLBuffer *pXStack_20;
  XMLCh curCh;
  XMLBuffer *toFill_local;
  XMLReader *this_local;
  
  pXStack_20 = toFill;
  toFill_local = (XMLBuffer *)this;
  do {
    while (this->fCharIndex < this->fCharsAvail) {
      local_22 = this->fCharBuf[this->fCharIndex];
      bVar1 = isWhitespace(this,local_22);
      if (!bVar1) {
        return true;
      }
      this->fCharIndex = this->fCharIndex + 1;
      if ((local_22 & 6U) == 0) {
        this->fCurCol = this->fCurCol + 1;
      }
      else {
        handleEOL(this,&local_22,false);
      }
      XMLBuffer::append(pXStack_20,local_22);
    }
    bVar1 = refreshCharBuffer(this);
  } while (bVar1);
  return false;
}

Assistant:

bool XMLReader::getSpaces(XMLBuffer& toFill)
{
    //
    //  We just loop until we either hit a non-space or the end of this
    //  entity. We return true if we returned because of a non-space and
    //  false if because of end of entity.
    //
    //  NOTE:   We have to maintain line/col info here and we have to do
    //          whitespace normalization if we are not already internalized.
    //
    while (true)
    {
        // Loop through the current chars in the buffer
        while (fCharIndex < fCharsAvail)
        {
            // Get the current char out of the buffer
            XMLCh curCh = fCharBuf[fCharIndex];

            //
            //  See if its a white space char. If so, then process it. Else
            //  we've hit a non-space and need to return.
            //
            if (isWhitespace(curCh))
            {
                // Eat this char
                fCharIndex++;

                //
                //  'curCh' is a whitespace(x20|x9|xD|xA), so we only can have
                //  end-of-line combinations with a leading chCR(xD) or chLF(xA)
                //
                //  100000 x20
                //  001001 x9
                //  001010 chLF
                //  001101 chCR
                //  -----------
                //  000110 == (chCR|chLF) & ~(0x9|0x20)
                //
                //  if the result of thelogical-& operation is
                //  true  : 'curCh' must be xA  or xD
                //  false : 'curCh' must be x20 or x9
                //
                if ( ( curCh & (chCR|chLF) & ~(0x9|0x20) ) == 0 )
                {
                    fCurCol++;
                } else
                {
                    handleEOL(curCh, false);
                }

                // Ok we can add this guy to our buffer
                toFill.append(curCh);
            }
             else
            {
                // Return true to indicate we broke out due to a whitespace
                return true;
            }
        }

        //
        //  We've eaten up the current buffer, so lets try to reload it. If
        //  we don't get anything new, then break out. If we do, then we go
        //  back to the top to keep getting spaces.
        //
        if (!refreshCharBuffer())
            break;
    }
    return false;
}